

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateXdistance::Initialize
          (ChLinkMateXdistance *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpt1,
          ChVector<double> *mpt2,ChVector<double> mdir2)

{
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> _Stack_c8;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_b8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,&mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_c8,&mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  local_48.m_data[0] = mpt1->m_data[0];
  local_48.m_data[1] = mpt1->m_data[1];
  local_48.m_data[2] = mpt1->m_data[2];
  local_68.m_data[0] = mpt2->m_data[0];
  local_68.m_data[1] = mpt2->m_data[1];
  local_68.m_data[2] = mpt2->m_data[2];
  local_a8.m_data[0] = *(double *)mdir2.m_data[0];
  local_a8.m_data[1] = *(double *)((long)mdir2.m_data[0] + 8);
  local_a8.m_data[2] = *(double *)((long)mdir2.m_data[0] + 0x10);
  local_88.m_data[0] = local_a8.m_data[0];
  local_88.m_data[1] = local_a8.m_data[1];
  local_88.m_data[2] = local_a8.m_data[2];
  ChLinkMateGeneric::Initialize
            (&this->super_ChLinkMateGeneric,(shared_ptr<chrono::ChBodyFrame> *)&local_b8,
             (shared_ptr<chrono::ChBodyFrame> *)&_Stack_c8,pos_are_relative,&local_48,&local_68,
             &local_88,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_c8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  return;
}

Assistant:

void ChLinkMateXdistance::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                     std::shared_ptr<ChBodyFrame> mbody2,
                                     bool pos_are_relative,
                                     ChVector<> mpt1,
                                     ChVector<> mpt2,
                                     ChVector<> mdir2) {
    ChLinkMateGeneric::Initialize(mbody1, mbody2, pos_are_relative, mpt1, mpt2, mdir2, mdir2);
}